

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

uint32_t lj_tab_keyindex(GCtab *t,cTValue *key)

{
  double dVar1;
  int iVar2;
  uint32_t uVar3;
  Node *pNVar4;
  
  if ((ushort)(key->u64 >> 0x30) < 0xfff9) {
    dVar1 = key->n;
    if ((uint)(int)dVar1 < t->asize) {
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
        return (int)dVar1 + 1;
      }
    }
  }
  if (key->u64 == 0xffffffffffffffff) {
    uVar3 = 0;
  }
  else {
    pNVar4 = hashkey(t,key);
    do {
      iVar2 = lj_obj_equal(&pNVar4->key,key);
      if (iVar2 != 0) {
        return (int)((long)pNVar4 + (0x18 - (t->node).ptr64) >> 3) * -0x55555555 + t->asize;
      }
      pNVar4 = (Node *)(pNVar4->next).ptr64;
    } while (pNVar4 != (Node *)0x0);
    uVar3 = 0xffffffff;
    if ((key->field_4).it == 0xfffe7fff) {
      uVar3 = (key->u32).lo;
    }
  }
  return uVar3;
}

Assistant:

uint32_t LJ_FASTCALL lj_tab_keyindex(GCtab *t, cTValue *key)
{
  TValue tmp;
  if (tvisint(key)) {
    int32_t k = intV(key);
    if ((uint32_t)k < t->asize)
      return (uint32_t)k + 1;
    setnumV(&tmp, (lua_Number)k);
    key = &tmp;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if ((uint32_t)k < t->asize && nk == (lua_Number)k)
      return (uint32_t)k + 1;
  }
  if (!tvisnil(key)) {
    Node *n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return t->asize + (uint32_t)((n+1) - noderef(t->node));
    } while ((n = nextnode(n)));
    if (key->u32.hi == LJ_KEYINDEX)  /* Despecialized ITERN while running. */
      return key->u32.lo;
    return ~0u;  /* Invalid key to next. */
  }
  return 0;  /* A nil key starts the traversal. */
}